

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O0

void do_stepmax(void *ptr,int nelem,int type)

{
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  int i;
  Integer in_stack_00000138;
  char *in_stack_00000140;
  int local_14;
  
  switch(in_EDX) {
  case 0x3e9:
    for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
      if (0 < *(int *)(in_RDI + (long)local_14 * 4)) {
        *(undefined4 *)(in_RDI + (long)local_14 * 4) = 0x80000001;
      }
    }
    break;
  case 0x3ea:
    for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
      if (0 < *(long *)(in_RDI + (long)local_14 * 8)) {
        *(undefined8 *)(in_RDI + (long)local_14 * 8) = 0x8000000000000001;
      }
    }
    break;
  case 0x3ec:
    for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
      if (0.0 < *(double *)(in_RDI + (long)local_14 * 8)) {
        *(undefined8 *)(in_RDI + (long)local_14 * 8) = 0xffac7b1f3cac7433;
      }
    }
    break;
  default:
    pnga_error(in_stack_00000140,in_stack_00000138);
    break;
  case 0x3ee:
  case 0x3ef:
    pnga_error(in_stack_00000140,in_stack_00000138);
  case 0x3eb:
    for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
      if (0.0 < *(float *)(in_RDI + (long)local_14 * 4)) {
        *(undefined4 *)(in_RDI + (long)local_14 * 4) = 0xfcf0bdc2;
      }
    }
  }
  return;
}

Assistant:

static void do_stepmax(void *ptr, int nelem, int type)
/*
  Look at elements one by one and replace the positive with negative infinity.
*/ 
{
    int i;
    switch (type){
         int *ia,i_0;
         double *da,d_0;
         float *fa,f_0;
	 long *la,l_0;


  	 case C_DBL:
                /*Only double data type will be handled for TAO/GA project*/ 
              da = (double *) ptr;
	      d_0 = (double) 0.0;
	      /* Modified 01/24/04 to use _D ending. */
              for(i=0;i<nelem;i++) 
		if(da[i]>d_0) da[i]=-GA_INFINITY_D;
              break;
         case C_INT:
	   /* Thix case added 01/24/04*/
              ia = (int *) ptr;
	      i_0 = (int)0;
              for(i=0;i<nelem;i++) 
		if(ia[i]>i_0)ia[i]=-GA_INFINITY_I;
              break;
         case C_DCPL:
         case C_SCPL:
	   /* This operation is not well defined for complex
	      numbers . This statement added when drop through
	      behavior changed by adding code for C_FLOAT and C_LONG
	      cases below. 01/24/04
	   */
	   pnga_error("do_stepmax:wrong data type",type);
         case C_FLOAT:
	   /* Thix case added 01/24/04*/
              fa = (float *) ptr;
	      f_0 = (float) 0.0;
              for(i=0;i<nelem;i++) 
		if(fa[i]>f_0) fa[i]=-GA_INFINITY_F;
              break;
         case C_LONG:
	   /* Thix case added 01/24/04*/
              la = (long *) ptr;
	      l_0 = (long)0;
              for(i=0;i<nelem;i++)
		if(la[i]>l_0) la[i]=-GA_INFINITY_L;
              break;
         default: pnga_error("do_stepmax:wrong data type",type);
    }
}